

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline_finish_event.cpp
# Opt level: O3

void __thiscall duckdb::PipelineFinishEvent::Schedule(PipelineFinishEvent *this)

{
  Executor *pEVar1;
  element_type *peVar2;
  __weak_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  type pPVar4;
  enable_shared_from_this<duckdb::Task> *object;
  vector<duckdb::shared_ptr<duckdb::Task,_true>,_true> tasks;
  _Head_base<0UL,_duckdb::PipelineFinishTask_*,_false> local_70;
  vector<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  local_68;
  enable_shared_from_this<duckdb::Event> local_48;
  shared_ptr<duckdb::Task,_true> local_38;
  vector<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  local_28;
  
  local_68.
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pPVar4 = shared_ptr<duckdb::Pipeline,_true>::operator*(&(this->super_BasePipelineEvent).pipeline);
  enable_shared_from_this<duckdb::Event>::shared_from_this(&local_48);
  local_70._M_head_impl = (PipelineFinishTask *)operator_new(0x58);
  _Var3._M_pi = local_48.__weak_this_.internal.
                super___weak_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  peVar2 = local_48.__weak_this_.internal.
           super___weak_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_48.__weak_this_.internal.super___weak_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  local_48.__weak_this_.internal.super___weak_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  pEVar1 = pPVar4->executor;
  ((local_70._M_head_impl)->super_ExecutorTask).super_Task.
  super_enable_shared_from_this<duckdb::Task>.__weak_this_.internal.
  super___weak_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  ((local_70._M_head_impl)->super_ExecutorTask).super_Task.
  super_enable_shared_from_this<duckdb::Task>.__weak_this_.internal.
  super___weak_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ((local_70._M_head_impl)->super_ExecutorTask).super_Task.token.ptr = (ProducerToken *)0x0;
  ((local_70._M_head_impl)->super_ExecutorTask).super_Task._vptr_Task =
       (_func_int **)&PTR__ExecutorTask_0246d7e8;
  ((local_70._M_head_impl)->super_ExecutorTask).executor = pEVar1;
  ((local_70._M_head_impl)->super_ExecutorTask).event.internal.
  super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
  ((local_70._M_head_impl)->super_ExecutorTask).event.internal.
  super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var3._M_pi;
  ((local_70._M_head_impl)->super_ExecutorTask).thread_context.
  super_unique_ptr<duckdb::ThreadContext,_std::default_delete<duckdb::ThreadContext>_>._M_t.
  super___uniq_ptr_impl<duckdb::ThreadContext,_std::default_delete<duckdb::ThreadContext>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::ThreadContext_*,_std::default_delete<duckdb::ThreadContext>_>.
  super__Head_base<0UL,_duckdb::ThreadContext_*,_false> =
       (_Head_base<0UL,_duckdb::ThreadContext_*,_false>)0x0;
  ((local_70._M_head_impl)->super_ExecutorTask).op.ptr = (PhysicalOperator *)0x0;
  ((local_70._M_head_impl)->super_ExecutorTask).context = pEVar1->context;
  LOCK();
  (pEVar1->executor_tasks).super___atomic_base<unsigned_long>._M_i =
       (pEVar1->executor_tasks).super___atomic_base<unsigned_long>._M_i + 1;
  UNLOCK();
  ((local_70._M_head_impl)->super_ExecutorTask).super_Task._vptr_Task =
       (_func_int **)&PTR__ExecutorTask_0246dd28;
  (local_70._M_head_impl)->pipeline = pPVar4;
  ::std::__shared_ptr<duckdb::Task,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<duckdb::PipelineFinishTask,std::default_delete<duckdb::PipelineFinishTask>,void>
            ((__shared_ptr<duckdb::Task,(__gnu_cxx::_Lock_policy)2> *)&local_38,
             (unique_ptr<duckdb::PipelineFinishTask,_std::default_delete<duckdb::PipelineFinishTask>_>
              *)&local_70);
  object = &(local_38.internal.super___shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
            ->super_enable_shared_from_this<duckdb::Task>;
  if (local_38.internal.super___shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (Task *)0x0) {
    object = (enable_shared_from_this<duckdb::Task> *)0x0;
  }
  shared_ptr<duckdb::Task,_true>::__enable_weak_this<duckdb::Task,_duckdb::Task,_0>
            (&local_38,object,
             local_38.internal.super___shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  ::std::
  vector<duckdb::shared_ptr<duckdb::Task,true>,std::allocator<duckdb::shared_ptr<duckdb::Task,true>>>
  ::emplace_back<duckdb::shared_ptr<duckdb::Task,true>>
            ((vector<duckdb::shared_ptr<duckdb::Task,true>,std::allocator<duckdb::shared_ptr<duckdb::Task,true>>>
              *)&local_68,&local_38);
  if (local_38.internal.super___shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.internal.super___shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_70._M_head_impl != (PipelineFinishTask *)0x0) {
    (*((local_70._M_head_impl)->super_ExecutorTask).super_Task._vptr_Task[1])();
  }
  local_70._M_head_impl = (PipelineFinishTask *)0x0;
  if (local_48.__weak_this_.internal.super___weak_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.__weak_this_.internal.
               super___weak_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  local_28.
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_68.
       super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_28.
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_68.
       super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_28.
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_68.
       super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_68.
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Event::SetTasks((Event *)this,(vector<duckdb::shared_ptr<duckdb::Task,_true>,_true> *)&local_28);
  ::std::
  vector<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ::~vector(&local_28);
  ::std::
  vector<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ::~vector(&local_68);
  return;
}

Assistant:

void PipelineFinishEvent::Schedule() {
	vector<shared_ptr<Task>> tasks;
	tasks.push_back(make_uniq<PipelineFinishTask>(*pipeline, shared_from_this()));
	SetTasks(std::move(tasks));
}